

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpanel_bmod.c
# Opt level: O0

void cpanel_bmod(int m,int w,int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  flops_t *pfVar10;
  int *piVar11;
  int *piVar12;
  int_t *piVar13;
  int_t *piVar14;
  void *pvVar15;
  int_t *piVar16;
  singlecomplex sVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int ldm;
  int nrow_00;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  singlecomplex *psVar28;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  float ci_19;
  float cr_19;
  float ci_18;
  float cr_18;
  float ci_17;
  float cr_17;
  float ci_16;
  float cr_16;
  float ci_15;
  float cr_15;
  float ci_14;
  float cr_14;
  float ci_13;
  float cr_13;
  float ci_12;
  float cr_12;
  float ci_11;
  float cr_11;
  float ci_10;
  float cr_10;
  float ci_9;
  float cr_9;
  float ci_8;
  float cr_8;
  float ci_7;
  float cr_7;
  float ci_6;
  float cr_6;
  float ci_5;
  float cr_5;
  float ci_4;
  float cr_4;
  float ci_3;
  float cr_3;
  float ci_2;
  float cr_2;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  flops_t *ops;
  int colblk;
  int rowblk;
  int maxsuper;
  int r_hi;
  int r_ind;
  int ldaTmp;
  singlecomplex comp_temp1;
  singlecomplex comp_temp;
  singlecomplex one;
  singlecomplex zero;
  singlecomplex *MatvecTmp;
  singlecomplex *TriTmp;
  singlecomplex *tempv1;
  singlecomplex *dense_col;
  int *repfnz_col;
  int_t *xlusup;
  singlecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int local_90;
  int jj;
  int i;
  int isub1;
  int isub;
  int no_zeros;
  int irow;
  int kfnz;
  int_t lptr;
  int block_nrow;
  int segsze;
  int_t luptr2;
  int_t luptr1;
  int_t luptr;
  singlecomplex ukj2;
  singlecomplex ukj1;
  singlecomplex ukj;
  int krep_ind;
  int krep;
  int nrow;
  int nsupr;
  int nsupc;
  int fsupc;
  int ksub;
  int k;
  singlecomplex *tempv_local;
  singlecomplex *dense_local;
  int nseg_local;
  int jcol_local;
  int w_local;
  int m_local;
  
  memset(&one,0,8);
  pfVar10 = stat->ops;
  piVar11 = Glu->xsup;
  piVar12 = Glu->supno;
  piVar13 = Glu->lsub;
  piVar14 = Glu->xlsub;
  pvVar15 = Glu->lusup;
  piVar16 = Glu->xlusup;
  iVar18 = sp_ienv(3);
  iVar19 = sp_ienv(7);
  if (iVar19 < iVar18) {
    local_1d8 = sp_ienv(3);
  }
  else {
    local_1d8 = sp_ienv(7);
  }
  iVar18 = sp_ienv(4);
  iVar19 = sp_ienv(5);
  iVar20 = local_1d8 + iVar18;
  fsupc = nseg + -1;
  for (nsupc = 0; nsupc < nseg; nsupc = nsupc + 1) {
    iVar6 = segrep[fsupc];
    iVar7 = piVar11[piVar12[iVar6]];
    iVar21 = iVar6 - iVar7;
    iVar22 = iVar21 + 1;
    ldm = piVar14[iVar7 + 1] - piVar14[iVar7];
    nrow_00 = ldm - iVar22;
    iVar8 = piVar14[iVar7];
    iVar23 = iVar8 + iVar22;
    iVar24 = iVar23 + -1;
    dense_col = (singlecomplex *)repfnz;
    tempv1 = dense;
    xsup._4_4_ = jcol;
    if ((iVar22 < iVar19) || (MatvecTmp = tempv, nrow_00 <= iVar18)) {
      for (; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        fVar9 = (&dense_col->r)[iVar6];
        if (fVar9 != -NAN) {
          iVar25 = (iVar6 - (int)fVar9) + 1;
          iVar27 = piVar16[iVar7];
          pfVar10[0x13] = (float)(iVar25 * 4 * (iVar6 - (int)fVar9)) + pfVar10[0x13];
          pfVar10[0x14] = (float)(nrow_00 * 8 * iVar25) + pfVar10[0x14];
          if (iVar25 == 1) {
            sVar17 = tempv1[piVar13[iVar24]];
            luptr2 = ldm * iVar21 + iVar22 + iVar27;
            for (local_90 = iVar8 + iVar22; local_90 < piVar14[iVar7 + 1]; local_90 = local_90 + 1)
            {
              iVar27 = piVar13[local_90];
              ukj1.r = sVar17.r;
              ukj1.i = sVar17.i;
              fVar9 = *(float *)((long)pvVar15 + (long)luptr2 * 8);
              fVar1 = *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4);
              tempv1[iVar27].r =
                   tempv1[iVar27].r -
                   (ukj1.r * *(float *)((long)pvVar15 + (long)luptr2 * 8) +
                   -(ukj1.i * *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4)));
              tempv1[iVar27].i = tempv1[iVar27].i - (ukj1.i * fVar9 + ukj1.r * fVar1);
              luptr2 = luptr2 + 1;
            }
          }
          else if (iVar25 < 4) {
            luptr2 = ldm * iVar21 + iVar22 + -1 + iVar27;
            segsze = luptr2 - ldm;
            ukj2.r = tempv1[piVar13[iVar23 + -2]].r;
            ukj2.i = tempv1[piVar13[iVar23 + -2]].i;
            ukj1.r = tempv1[piVar13[iVar24]].r;
            ukj1.i = tempv1[piVar13[iVar24]].i;
            if (iVar25 == 2) {
              ukj1.r = ukj1.r - (ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)));
              ukj1.i = ukj1.i - (ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8 + 4));
              tempv1[piVar13[iVar24]] = ukj1;
              for (local_90 = iVar8 + iVar22; local_90 < piVar14[iVar7 + 1]; local_90 = local_90 + 1
                  ) {
                iVar27 = piVar13[local_90];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                fVar9 = *(float *)((long)pvVar15 + (long)luptr2 * 8);
                fVar1 = *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4);
                fVar2 = *(float *)((long)pvVar15 + (long)segsze * 8);
                fVar3 = *(float *)((long)pvVar15 + (long)segsze * 8 + 4);
                tempv1[iVar27].r =
                     tempv1[iVar27].r -
                     (ukj1.r * *(float *)((long)pvVar15 + (long)luptr2 * 8) +
                      -(ukj1.i * *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4)) +
                     ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                     -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)));
                tempv1[iVar27].i =
                     tempv1[iVar27].i -
                     (ukj1.i * fVar9 + ukj1.r * fVar1 + ukj2.i * fVar2 + ukj2.r * fVar3);
              }
            }
            else {
              block_nrow = segsze - ldm;
              luptr1 = (int_t)tempv1[piVar13[iVar23 + -3]].r;
              luptr = (int_t)tempv1[piVar13[iVar23 + -3]].i;
              ukj2.r = ukj2.r - ((float)luptr1 *
                                 *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8) +
                                -((float)luptr *
                                 *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8 + 4)));
              ukj2.i = ukj2.i - ((float)luptr *
                                 *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8) +
                                (float)luptr1 *
                                *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8 + 4));
              ukj1.r = ukj1.r - (ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                 -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)) +
                                (float)luptr1 * *(float *)((long)pvVar15 + (long)block_nrow * 8) +
                                -((float)luptr *
                                 *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4)));
              ukj1.i = ukj1.i - (ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                 ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8 + 4) +
                                (float)luptr * *(float *)((long)pvVar15 + (long)block_nrow * 8) +
                                (float)luptr1 * *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4)
                                );
              tempv1[piVar13[iVar24]] = ukj1;
              tempv1[piVar13[iVar23 + -2]] = ukj2;
              for (local_90 = iVar8 + iVar22; local_90 < piVar14[iVar7 + 1]; local_90 = local_90 + 1
                  ) {
                iVar27 = piVar13[local_90];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                block_nrow = block_nrow + 1;
                fVar9 = *(float *)((long)pvVar15 + (long)luptr2 * 8);
                fVar1 = *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4);
                fVar2 = *(float *)((long)pvVar15 + (long)segsze * 8);
                fVar3 = *(float *)((long)pvVar15 + (long)segsze * 8 + 4);
                fVar4 = *(float *)((long)pvVar15 + (long)block_nrow * 8);
                fVar5 = *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4);
                tempv1[iVar27].r =
                     tempv1[iVar27].r -
                     (ukj1.r * *(float *)((long)pvVar15 + (long)luptr2 * 8) +
                      -(ukj1.i * *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4)) +
                      ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                      -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)) +
                     (float)luptr1 * *(float *)((long)pvVar15 + (long)block_nrow * 8) +
                     -((float)luptr * *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4)));
                tempv1[iVar27].i =
                     tempv1[iVar27].i -
                     (ukj1.i * fVar9 + ukj1.r * fVar1 + ukj2.i * fVar2 + ukj2.r * fVar3 +
                     (float)luptr * fVar4 + (float)luptr1 * fVar5);
              }
            }
          }
          else {
            iVar26 = (int)fVar9 - iVar7;
            i = iVar8 + iVar26;
            for (local_90 = 0; local_90 < iVar25; local_90 = local_90 + 1) {
              tempv[local_90] = tempv1[piVar13[i]];
              i = i + 1;
            }
            iVar27 = ldm * iVar26 + iVar26 + iVar27;
            clsolve(ldm,iVar25,(singlecomplex *)((long)pvVar15 + (long)iVar27 * 8),tempv);
            psVar28 = tempv + iVar25;
            cmatvec(ldm,nrow_00,iVar25,
                    (singlecomplex *)((long)pvVar15 + (long)(iVar25 + iVar27) * 8),tempv,psVar28);
            i = iVar8 + iVar26;
            for (local_90 = 0; local_90 < iVar25; local_90 = local_90 + 1) {
              tempv1[piVar13[i]] = tempv[local_90];
              tempv[local_90] = one;
              i = i + 1;
            }
            for (local_90 = 0; local_90 < nrow_00; local_90 = local_90 + 1) {
              iVar27 = piVar13[i];
              tempv1[iVar27].r = tempv1[iVar27].r - psVar28[local_90].r;
              tempv1[iVar27].i = tempv1[iVar27].i - psVar28[local_90].i;
              psVar28[local_90] = one;
              i = i + 1;
            }
          }
        }
        dense_col = (singlecomplex *)(&dense_col->r + m);
        tempv1 = tempv1 + m;
      }
    }
    else {
      for (; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        fVar9 = (&dense_col->r)[iVar6];
        if (fVar9 != -NAN) {
          iVar25 = (iVar6 - (int)fVar9) + 1;
          iVar27 = piVar16[iVar7];
          pfVar10[0x13] = (float)(iVar25 * 4 * (iVar6 - (int)fVar9)) + pfVar10[0x13];
          pfVar10[0x14] = (float)(nrow_00 * 8 * iVar25) + pfVar10[0x14];
          if (iVar25 == 1) {
            sVar17 = tempv1[piVar13[iVar24]];
            luptr2 = ldm * iVar21 + iVar22 + iVar27;
            for (local_90 = iVar8 + iVar22; local_90 < piVar14[iVar7 + 1]; local_90 = local_90 + 1)
            {
              iVar27 = piVar13[local_90];
              ukj1.r = sVar17.r;
              ukj1.i = sVar17.i;
              fVar9 = *(float *)((long)pvVar15 + (long)luptr2 * 8);
              fVar1 = *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4);
              tempv1[iVar27].r =
                   tempv1[iVar27].r -
                   (ukj1.r * *(float *)((long)pvVar15 + (long)luptr2 * 8) +
                   -(ukj1.i * *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4)));
              tempv1[iVar27].i = tempv1[iVar27].i - (ukj1.i * fVar9 + ukj1.r * fVar1);
              luptr2 = luptr2 + 1;
            }
          }
          else if (iVar25 < 4) {
            luptr2 = ldm * iVar21 + iVar22 + -1 + iVar27;
            segsze = luptr2 - ldm;
            ukj2.r = tempv1[piVar13[iVar23 + -2]].r;
            ukj2.i = tempv1[piVar13[iVar23 + -2]].i;
            ukj1.r = tempv1[piVar13[iVar24]].r;
            ukj1.i = tempv1[piVar13[iVar24]].i;
            if (iVar25 == 2) {
              ukj1.r = ukj1.r - (ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)));
              ukj1.i = ukj1.i - (ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8 + 4));
              tempv1[piVar13[iVar24]] = ukj1;
              for (local_90 = iVar8 + iVar22; local_90 < piVar14[iVar7 + 1]; local_90 = local_90 + 1
                  ) {
                iVar27 = piVar13[local_90];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                fVar9 = *(float *)((long)pvVar15 + (long)luptr2 * 8);
                fVar1 = *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4);
                fVar2 = *(float *)((long)pvVar15 + (long)segsze * 8);
                fVar3 = *(float *)((long)pvVar15 + (long)segsze * 8 + 4);
                tempv1[iVar27].r =
                     tempv1[iVar27].r -
                     (ukj1.r * *(float *)((long)pvVar15 + (long)luptr2 * 8) +
                      -(ukj1.i * *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4)) +
                     ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                     -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)));
                tempv1[iVar27].i =
                     tempv1[iVar27].i -
                     (ukj1.i * fVar9 + ukj1.r * fVar1 + ukj2.i * fVar2 + ukj2.r * fVar3);
              }
            }
            else {
              block_nrow = segsze - ldm;
              luptr1 = (int_t)tempv1[piVar13[iVar23 + -3]].r;
              luptr = (int_t)tempv1[piVar13[iVar23 + -3]].i;
              ukj2.r = ukj2.r - ((float)luptr1 *
                                 *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8) +
                                -((float)luptr *
                                 *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8 + 4)));
              ukj2.i = ukj2.i - ((float)luptr *
                                 *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8) +
                                (float)luptr1 *
                                *(float *)((long)pvVar15 + (long)(block_nrow + -1) * 8 + 4));
              ukj1.r = ukj1.r - (ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                 -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)) +
                                (float)luptr1 * *(float *)((long)pvVar15 + (long)block_nrow * 8) +
                                -((float)luptr *
                                 *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4)));
              ukj1.i = ukj1.i - (ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8) +
                                 ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8 + 4) +
                                (float)luptr * *(float *)((long)pvVar15 + (long)block_nrow * 8) +
                                (float)luptr1 * *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4)
                                );
              tempv1[piVar13[iVar24]] = ukj1;
              tempv1[piVar13[iVar23 + -2]] = ukj2;
              for (local_90 = iVar8 + iVar22; local_90 < piVar14[iVar7 + 1]; local_90 = local_90 + 1
                  ) {
                iVar27 = piVar13[local_90];
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                block_nrow = block_nrow + 1;
                fVar9 = *(float *)((long)pvVar15 + (long)luptr2 * 8);
                fVar1 = *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4);
                fVar2 = *(float *)((long)pvVar15 + (long)segsze * 8);
                fVar3 = *(float *)((long)pvVar15 + (long)segsze * 8 + 4);
                fVar4 = *(float *)((long)pvVar15 + (long)block_nrow * 8);
                fVar5 = *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4);
                tempv1[iVar27].r =
                     tempv1[iVar27].r -
                     (ukj1.r * *(float *)((long)pvVar15 + (long)luptr2 * 8) +
                      -(ukj1.i * *(float *)((long)pvVar15 + (long)luptr2 * 8 + 4)) +
                      ukj2.r * *(float *)((long)pvVar15 + (long)segsze * 8) +
                      -(ukj2.i * *(float *)((long)pvVar15 + (long)segsze * 8 + 4)) +
                     (float)luptr1 * *(float *)((long)pvVar15 + (long)block_nrow * 8) +
                     -((float)luptr * *(float *)((long)pvVar15 + (long)block_nrow * 8 + 4)));
                tempv1[iVar27].i =
                     tempv1[iVar27].i -
                     (ukj1.i * fVar9 + ukj1.r * fVar1 + ukj2.i * fVar2 + ukj2.r * fVar3 +
                     (float)luptr * fVar4 + (float)luptr1 * fVar5);
              }
            }
          }
          else {
            iVar26 = (int)fVar9 - iVar7;
            i = iVar8 + iVar26;
            for (local_90 = 0; local_90 < iVar25; local_90 = local_90 + 1) {
              MatvecTmp[local_90] = tempv1[piVar13[i]];
              i = i + 1;
            }
            clsolve(ldm,iVar25,
                    (singlecomplex *)((long)pvVar15 + (long)(ldm * iVar26 + iVar26 + iVar27) * 8),
                    MatvecTmp);
          }
        }
        dense_col = (singlecomplex *)(&dense_col->r + m);
        tempv1 = tempv1 + m;
        MatvecTmp = MatvecTmp + iVar20;
      }
      for (maxsuper = 0; maxsuper < nrow_00; maxsuper = iVar18 + maxsuper) {
        local_1dc = nrow_00;
        if (maxsuper + iVar18 <= nrow_00) {
          local_1dc = maxsuper + iVar18;
        }
        local_1e0 = iVar18;
        if (local_1dc - maxsuper <= iVar18) {
          local_1e0 = local_1dc - maxsuper;
        }
        iVar21 = piVar16[iVar7];
        dense_col = (singlecomplex *)repfnz;
        MatvecTmp = tempv;
        tempv1 = dense;
        for (xsup._4_4_ = jcol; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
          fVar9 = (&dense_col->r)[iVar6];
          if ((fVar9 != -NAN) && (iVar23 = (iVar6 - (int)fVar9) + 1, 3 < iVar23)) {
            psVar28 = MatvecTmp + local_1d8;
            cmatvec(ldm,local_1e0,iVar23,
                    (singlecomplex *)
                    ((long)pvVar15 +
                    (long)(iVar21 + iVar22 + maxsuper + ldm * ((int)fVar9 - iVar7)) * 8),MatvecTmp,
                    psVar28);
            i = iVar8 + iVar22 + maxsuper;
            for (local_90 = 0; local_90 < local_1e0; local_90 = local_90 + 1) {
              iVar23 = piVar13[i];
              tempv1[iVar23].r = tempv1[iVar23].r - psVar28[local_90].r;
              tempv1[iVar23].i = tempv1[iVar23].i - psVar28[local_90].i;
              psVar28[local_90] = one;
              i = i + 1;
            }
          }
          dense_col = (singlecomplex *)(&dense_col->r + m);
          tempv1 = tempv1 + m;
          MatvecTmp = MatvecTmp + iVar20;
        }
      }
      dense_col = (singlecomplex *)repfnz;
      MatvecTmp = tempv;
      tempv1 = dense;
      for (xsup._4_4_ = jcol; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        fVar9 = (&dense_col->r)[iVar6];
        if ((fVar9 != -NAN) && (iVar21 = (iVar6 - (int)fVar9) + 1, 3 < iVar21)) {
          i = iVar8 + ((int)fVar9 - iVar7);
          for (local_90 = 0; local_90 < iVar21; local_90 = local_90 + 1) {
            tempv1[piVar13[i]] = MatvecTmp[local_90];
            MatvecTmp[local_90] = one;
            i = i + 1;
          }
        }
        dense_col = (singlecomplex *)(&dense_col->r + m);
        tempv1 = tempv1 + m;
        MatvecTmp = MatvecTmp + iVar20;
      }
    }
    fsupc = fsupc + -1;
  }
  return;
}

Assistant:

void
cpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    singlecomplex     *dense,     /* out, of size n by w */
	    singlecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    singlecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    singlecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    singlecomplex       *dense_col;  /* dense[] for a column in the panel */
    singlecomplex       *tempv1;             /* Used in 1-D update */
    singlecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    clsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    cgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    cmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    clsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    cmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}